

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CERunningDate.cpp
# Opt level: O0

CERunningDate * __thiscall CERunningDate::operator=(CERunningDate *this,CERunningDate *other)

{
  CERunningDate *in_RSI;
  CERunningDate *in_RDI;
  
  if (in_RDI != in_RSI) {
    CEDate::operator=(&in_RSI->super_CEDate,&in_RDI->super_CEDate);
    free_members(in_RDI);
    init_members(in_RSI);
    copy_members(in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

CERunningDate& CERunningDate::operator=(const CERunningDate& other)
{
    if (this != &other) {
        this->CEDate::operator=(other);
        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}